

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O3

ssize_t add_from_client(void *reader_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  CURLcode CVar1;
  size_t sVar2;
  _Bool eos;
  size_t nread;
  _Bool local_19;
  size_t local_18;
  
  CVar1 = Curl_client_read((Curl_easy *)reader_ctx,(char *)buf,buflen,&local_18,&local_19);
  *err = CVar1;
  sVar2 = 0xffffffffffffffff;
  if ((CVar1 == CURLE_OK) && (sVar2 = local_18, local_19 == true)) {
    *(byte *)((long)reader_ctx + 0x1c9) = *(byte *)((long)reader_ctx + 0x1c9) | 0x20;
  }
  return sVar2;
}

Assistant:

static ssize_t add_from_client(void *reader_ctx,
                               unsigned char *buf, size_t buflen,
                               CURLcode *err)
{
  struct Curl_easy *data = reader_ctx;
  size_t nread;
  bool eos;

  *err = Curl_client_read(data, (char *)buf, buflen, &nread, &eos);
  if(*err)
    return -1;
  if(eos)
    data->req.eos_read = TRUE;
  return (ssize_t)nread;
}